

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::raft_server(raft_server *this,context *ctx,init_options *opt)

{
  ulong uVar1;
  long *__a;
  bool bVar2;
  bool bVar3;
  log_val_type lVar4;
  int iVar5;
  result_type rVar6;
  int32 iVar7;
  element_type *peVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  void *pvVar10;
  element_type *peVar11;
  uint64_t uVar12;
  element_type *peVar13;
  raft_server *this_00;
  ostream *poVar14;
  ostream *poVar15;
  __int_type _Var16;
  ulong uVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  element_type *peVar18;
  undefined4 extraout_var_02;
  unsigned_long *puVar19;
  undefined4 extraout_var_03;
  element_type *this_01;
  element_type *peVar20;
  string *psVar21;
  size_type sVar22;
  element_type *peVar23;
  undefined8 uVar24;
  long in_RDX;
  char *pcVar25;
  undefined8 *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_shared_ptr<peer>_>_&&>::value,_pair<iterator,_bool>_>
  _Var26;
  executor exec;
  ptr<srv_config> cur_srv;
  iterator it;
  iterator srvs_end;
  stringstream peer_info_msg;
  ptr<log_entry> entry;
  ulong i;
  stringstream init_msg;
  ptr<cluster_config> c_conf;
  uniform_int_distribution<int> distribution;
  default_random_engine engine;
  uint8_t *last;
  uint8_t *first;
  uint64_t seed;
  ptr<raft_params> params;
  pointer in_stack_fffffffffffff608;
  undefined4 in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff614;
  function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>
  *in_stack_fffffffffffff618;
  context *in_stack_fffffffffffff620;
  raft_server *in_stack_fffffffffffff628;
  undefined7 in_stack_fffffffffffff668;
  undefined1 in_stack_fffffffffffff66f;
  context *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff6c0;
  undefined2 in_stack_fffffffffffff6c4;
  undefined1 in_stack_fffffffffffff6c6;
  undefined1 in_stack_fffffffffffff6c7;
  raft_server *in_stack_fffffffffffff7e0;
  undefined1 skip_initial_election_timeout;
  string local_600 [32];
  string local_5e0 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_5c0;
  undefined1 local_5b8;
  int32 local_59c;
  code *local_578;
  undefined8 local_570;
  _Self local_520;
  _Self local_518;
  stringstream local_510 [16];
  ostream local_500;
  int local_384;
  string local_380 [32];
  undefined1 local_360 [16];
  unsigned_long local_350;
  unsigned_long local_348;
  ulong local_340;
  string local_338 [32];
  string local_318 [32];
  stringstream local_2f8 [16];
  ostream local_2e8;
  string local_150 [32];
  int local_130;
  int local_12c [5];
  long *local_118;
  long *local_110;
  long local_108;
  undefined8 uStack_100;
  __shared_ptr local_f8 [48];
  
  std::enable_shared_from_this<nuraft::raft_server>::enable_shared_from_this
            ((enable_shared_from_this<nuraft::raft_server> *)0x1d1008);
  *in_RDI = &PTR__raft_server_00251928;
  std::thread::thread((thread *)0x1d102f);
  std::thread::thread((thread *)0x1d1048);
  in_RDI[5] = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (__integral_type_conflict)((ulong)in_stack_fffffffffffff608 >> 0x20));
  peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d109a);
  iVar5 = (*peVar8->_vptr_state_mgr[7])();
  *(int *)(in_RDI + 7) = iVar5;
  *(undefined4 *)(in_RDI + 8) = 1;
  timer_helper::timer_helper
            ((timer_helper *)in_stack_fffffffffffff620,(size_t)in_stack_fffffffffffff618,
             SUB41((uint)in_stack_fffffffffffff614 >> 0x18,0));
  *(undefined4 *)(in_RDI + 0x11) = 0;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (__integral_type)in_stack_fffffffffffff608);
  peVar9 = std::__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d1131);
  (*peVar9->_vptr_state_machine[0x11])();
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (__integral_type)in_stack_fffffffffffff608);
  peVar9 = std::__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d1186);
  (*peVar9->_vptr_state_machine[0x11])();
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (__integral_type)in_stack_fffffffffffff608);
  peVar9 = std::__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d11db);
  iVar5 = (*peVar9->_vptr_state_machine[0x11])();
  in_RDI[0x17] = CONCAT44(extraout_var,iVar5);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  pre_vote_status_t::pre_vote_status_t
            ((pre_vote_status_t *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  *(undefined1 *)(in_RDI + 0x1d) = 1;
  *(undefined1 *)((long)in_RDI + 0xe9) = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  pvVar10 = operator_new(0x60);
  EventAwaiter::EventAwaiter
            ((EventAwaiter *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  in_RDI[0x1f] = pvVar10;
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (__integral_type_conflict)((ulong)in_stack_fffffffffffff608 >> 0x20));
  timer_helper::timer_helper
            ((timer_helper *)in_stack_fffffffffffff620,(size_t)in_stack_fffffffffffff618,
             SUB41((uint)in_stack_fffffffffffff614 >> 0x18,0));
  *(undefined1 *)(in_RDI + 0x29) = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  *(undefined4 *)((long)in_RDI + 0x14c) = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::unique_ptr<nuraft::context,std::default_delete<nuraft::context>>::
  unique_ptr<std::default_delete<nuraft::context>,void>
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),in_stack_fffffffffffff608
            );
  std::shared_ptr<nuraft::delayed_task_scheduler>::shared_ptr
            ((shared_ptr<nuraft::delayed_task_scheduler> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (shared_ptr<nuraft::delayed_task_scheduler> *)in_stack_fffffffffffff608);
  std::bind<void(nuraft::raft_server::*)(),nuraft::raft_server*>
            ((offset_in_raft_server_to_subr *)in_stack_fffffffffffff618,
             (raft_server **)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  std::function<void()>::
  function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*))()>,void>
            ((function<void_()> *)in_stack_fffffffffffff620,
             (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()> *)
             in_stack_fffffffffffff618);
  std::shared_ptr<nuraft::delayed_task>::shared_ptr
            ((shared_ptr<nuraft::delayed_task> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),in_stack_fffffffffffff608
            );
  timer_helper::timer_helper
            ((timer_helper *)in_stack_fffffffffffff620,(size_t)in_stack_fffffffffffff618,
             SUB41((uint)in_stack_fffffffffffff614 >> 0x18,0));
  std::
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  ::unordered_map((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                   *)0x1d152d);
  std::
  unordered_map<int,_std::shared_ptr<nuraft::rpc_client>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>_>_>
  ::unordered_map((unordered_map<int,_std::shared_ptr<nuraft::rpc_client>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::rpc_client>_>_>_>
                   *)0x1d1549);
  std::
  unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
  ::unordered_map((unordered_map<int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>_>
                   *)0x1d1565);
  std::__cxx11::
  list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ::list((list<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
          *)0x1d1581);
  std::mutex::mutex((mutex *)0x1d1595);
  std::atomic<nuraft::srv_role>::atomic((atomic<nuraft::srv_role> *)(in_RDI + 0x59),follower);
  peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d15d1);
  (*peVar8->_vptr_state_mgr[5])(in_RDI + 0x5a);
  peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d160a);
  (*peVar8->_vptr_state_mgr[6])(in_RDI + 0x5c);
  std::shared_ptr<nuraft::state_machine>::shared_ptr
            ((shared_ptr<nuraft::state_machine> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (shared_ptr<nuraft::state_machine> *)in_stack_fffffffffffff608);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (__integral_type)in_stack_fffffffffffff608);
  *(undefined4 *)(in_RDI + 0x62) = 0;
  std::shared_ptr<nuraft::logger>::shared_ptr
            ((shared_ptr<nuraft::logger> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (shared_ptr<nuraft::logger> *)in_stack_fffffffffffff608);
  std::function<int_()>::function
            ((function<int_()> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  std::shared_ptr<nuraft::cluster_config>::shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),in_stack_fffffffffffff608
            );
  peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d171f);
  (*peVar8->_vptr_state_mgr[2])(in_RDI + 0x6b);
  std::mutex::mutex((mutex *)0x1d1749);
  std::shared_ptr<nuraft::cluster_config>::shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),in_stack_fffffffffffff608
            );
  std::shared_ptr<nuraft::peer>::shared_ptr
            ((shared_ptr<nuraft::peer> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),in_stack_fffffffffffff608
            );
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  std::shared_ptr<nuraft::peer>::shared_ptr
            ((shared_ptr<nuraft::peer> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),in_stack_fffffffffffff608
            );
  in_RDI[0x79] = 0;
  std::shared_ptr<nuraft::srv_config>::shared_ptr
            ((shared_ptr<nuraft::srv_config> *)
             CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),in_stack_fffffffffffff608
            );
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x1d181e);
  std::mutex::mutex((mutex *)0x1d1832);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x86));
  std::mutex::mutex((mutex *)0x1d1862);
  std::mutex::mutex((mutex *)0x1d1876);
  std::mutex::mutex((mutex *)0x1d188a);
  std::
  map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  ::map((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
         *)0x1d18a6);
  std::mutex::mutex((mutex *)0x1d18ba);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xa6));
  std::mutex::mutex((mutex *)0x1d18ea);
  std::
  bind<void(nuraft::raft_server::*)(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&),nuraft::raft_server*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((offset_in_raft_server_to_subr *)in_stack_fffffffffffff628,
             (raft_server **)in_stack_fffffffffffff620,(_Placeholder<1> *)in_stack_fffffffffffff618,
             (_Placeholder<2> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
  function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
            ((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)in_stack_fffffffffffff620,
             (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)in_stack_fffffffffffff618);
  std::
  bind<void(nuraft::raft_server::*)(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&),nuraft::raft_server*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((offset_in_raft_server_to_subr *)in_stack_fffffffffffff628,
             (raft_server **)in_stack_fffffffffffff620,(_Placeholder<1> *)in_stack_fffffffffffff618,
             (_Placeholder<2> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
  function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
            ((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)in_stack_fffffffffffff620,
             (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)in_stack_fffffffffffff618);
  peVar9 = std::__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d1a13);
  (*peVar9->_vptr_state_machine[0x10])(in_RDI + 0xb9);
  std::mutex::mutex((mutex *)0x1d1a40);
  timer_helper::timer_helper
            ((timer_helper *)in_stack_fffffffffffff620,(size_t)in_stack_fffffffffffff618,
             SUB41((uint)in_stack_fffffffffffff614 >> 0x18,0));
  timer_helper::timer_helper
            ((timer_helper *)in_stack_fffffffffffff620,(size_t)in_stack_fffffffffffff618,
             SUB41((uint)in_stack_fffffffffffff614 >> 0x18,0));
  timer_helper::timer_helper
            ((timer_helper *)in_stack_fffffffffffff620,(size_t)in_stack_fffffffffffff618,
             SUB41((uint)in_stack_fffffffffffff614 >> 0x18,0));
  pvVar10 = operator_new(0x60);
  EventAwaiter::EventAwaiter
            ((EventAwaiter *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  in_RDI[0xd9] = pvVar10;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             SUB81((ulong)in_stack_fffffffffffff608 >> 0x38,0));
  bVar2 = std::function::operator_cast_to_bool
                    ((function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>
                      *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
  if (bVar2) {
    std::function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>::
    function((function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>
              *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    context::set_cb_func
              (in_stack_fffffffffffff670,
               (func_type *)CONCAT17(in_stack_fffffffffffff66f,in_stack_fffffffffffff668));
    std::function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>::
    ~function((function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>
               *)0x1d1b67);
  }
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1d1cec);
  context::get_params((context *)in_stack_fffffffffffff628);
  peVar11 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d1d0b);
  iVar5 = peVar11->stale_log_gap_;
  peVar11 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d1d22);
  if (iVar5 < peVar11->fresh_log_gap_) {
    peVar11 = std::
              __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d1d3e);
    iVar7 = peVar11->fresh_log_gap_;
    peVar11 = std::
              __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d1d55);
    peVar11->stale_log_gap_ = iVar7;
  }
  peVar11 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d1d6c);
  uStack_100._7_1_ = 0;
  bVar2 = false;
  if ((peVar11->enable_randomized_snapshot_creation_ & 1U) != 0) {
    get_last_snapshot(in_stack_fffffffffffff628);
    uStack_100._7_1_ = 1;
    bVar3 = std::__shared_ptr::operator_cast_to_bool(local_f8);
    bVar2 = false;
    if (!bVar3) {
      peVar11 = std::
                __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d1dce);
      bVar2 = 1 < peVar11->snapshot_distance_;
    }
  }
  if ((uStack_100._7_1_ & 1) != 0) {
    std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x1d1e03);
  }
  if (bVar2) {
    uVar12 = timer_helper::get_timeofday_us();
    local_108 = uVar12 * (long)*(int *)(in_RDI + 7);
    local_110 = &local_108;
    local_118 = &uStack_100;
    while( true ) {
      __a = local_110;
      bVar2 = false;
      if (local_110 != local_118) {
        local_118 = (long *)((long)local_118 + -1);
        bVar2 = local_110 != local_118;
      }
      if (!bVar2) break;
      local_110 = (long *)((long)local_110 + 1);
      std::swap<unsigned_char>((uchar *)__a,(uchar *)local_118);
    }
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
               (result_type_conflict)in_stack_fffffffffffff608);
    std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1d1f22);
    peVar11 = std::
              __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d1f42);
    local_12c[0] = peVar11->snapshot_distance_ / 2;
    peVar11 = std::
              __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d1f62);
    local_130 = peVar11->snapshot_distance_ + -1;
    std::max<int>(local_12c,&local_130);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)
               CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
               (int)((ulong)in_stack_fffffffffffff608 >> 0x20),(int)in_stack_fffffffffffff608);
    rVar6 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)
                       CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       in_stack_fffffffffffff608);
    *(result_type *)(in_RDI + 0x62) = rVar6;
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 99));
    if (bVar2) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2009);
      iVar5 = (*peVar23->_vptr_logger[7])();
      if (3 < iVar5) {
        peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d2042);
        msg_if_given_abi_cxx11_
                  ((char *)local_150,"First snapshot creation log distance %u",
                   (ulong)*(uint *)(in_RDI + 0x62));
        (*peVar23->_vptr_logger[8])
                  (peVar23,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"raft_server",0x89,local_150);
        std::__cxx11::string::~string(local_150);
      }
    }
  }
  apply_and_log_current_params(in_stack_fffffffffffff7e0);
  update_rand_timeout((raft_server *)
                      CONCAT17(in_stack_fffffffffffff6c7,
                               CONCAT16(in_stack_fffffffffffff6c6,
                                        CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0
                                                ))));
  peVar13 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d2110);
  (*peVar13->_vptr_log_store[2])();
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff620,
             (__int_type)in_stack_fffffffffffff618);
  peVar13 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d2159);
  (*peVar13->_vptr_log_store[2])();
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff620,
             (__int_type)in_stack_fffffffffffff618);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x5a));
  if (!bVar2) {
    cs_new<nuraft::srv_state>();
    std::shared_ptr<nuraft::srv_state>::operator=
              ((shared_ptr<nuraft::srv_state> *)
               CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
               (shared_ptr<nuraft::srv_state> *)in_stack_fffffffffffff608);
    std::shared_ptr<nuraft::srv_state>::~shared_ptr((shared_ptr<nuraft::srv_state> *)0x1d21f3);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d2200);
    srv_state::set_term((srv_state *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
                        (ulong)in_stack_fffffffffffff608);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d2222);
    srv_state::set_voted_for
              ((srv_state *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
               (int)((ulong)in_stack_fffffffffffff608 >> 0x20));
  }
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d2247);
  this_00 = (raft_server *)srv_state::get_term((srv_state *)0x1d224f);
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff620,
             (__int_type)in_stack_fffffffffffff618);
  get_config(in_stack_fffffffffffff628);
  std::__cxx11::stringstream::stringstream(local_2f8);
  poVar14 = std::operator<<(&local_2e8,"   === INIT RAFT SERVER ===\n");
  poVar15 = std::operator<<(poVar14,"commit index ");
  _Var16 = std::__atomic_base::operator_cast_to_unsigned_long
                     ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff618);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,_Var16);
  poVar15 = std::operator<<(poVar15,"\n");
  poVar15 = std::operator<<(poVar15,"term ");
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d2355);
  uVar17 = srv_state::get_term((srv_state *)0x1d235d);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,uVar17);
  poVar15 = std::operator<<(poVar15,"\n");
  poVar15 = std::operator<<(poVar15,"election timer ");
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1d23d6);
  bVar2 = srv_state::is_election_timer_allowed((srv_state *)0x1d23de);
  pcVar25 = "not allowed";
  if (bVar2) {
    pcVar25 = "allowed";
  }
  poVar15 = std::operator<<(poVar15,pcVar25);
  poVar15 = std::operator<<(poVar15,"\n");
  poVar15 = std::operator<<(poVar15,"log store start ");
  peVar13 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d246a);
  iVar5 = (*peVar13->_vptr_log_store[3])();
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,CONCAT44(extraout_var_00,iVar5));
  poVar15 = std::operator<<(poVar15,", end ");
  peVar13 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d24d1);
  iVar5 = (*peVar13->_vptr_log_store[2])();
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,CONCAT44(extraout_var_01,iVar5) - 1);
  poVar15 = std::operator<<(poVar15,"\n");
  poVar15 = std::operator<<(poVar15,"config log idx ");
  peVar18 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d2552);
  uVar17 = cluster_config::get_log_idx(peVar18);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,uVar17);
  poVar15 = std::operator<<(poVar15,", prev log idx ");
  peVar18 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d25ae);
  uVar17 = cluster_config::get_prev_log_idx(peVar18);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,uVar17);
  std::operator<<(poVar15,"\n");
  peVar18 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d2602);
  bVar2 = cluster_config::is_async_replication(peVar18);
  if (bVar2) {
    std::operator<<(&local_2e8," -- ASYNC REPLICATION --\n");
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 99));
  if (bVar2) {
    peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d269b);
    iVar5 = (*peVar23->_vptr_logger[7])();
    if (3 < iVar5) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d26d4);
      std::__cxx11::stringstream::str();
      uVar24 = std::__cxx11::string::c_str();
      msg_if_given_abi_cxx11_((char *)local_318,"%s",uVar24);
      (*peVar23->_vptr_logger[8])
                (peVar23,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"raft_server",0xa6,local_318);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_338);
    }
  }
  _Var16 = std::__atomic_base::operator_cast_to_unsigned_long
                     ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff618);
  local_348 = _Var16 + 1;
  peVar13 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d27e7);
  iVar5 = (*peVar13->_vptr_log_store[3])();
  local_350 = CONCAT44(extraout_var_02,iVar5);
  puVar19 = std::max<unsigned_long>(&local_348,&local_350);
  local_340 = *puVar19;
  while( true ) {
    uVar1 = local_340;
    peVar13 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2863);
    iVar5 = (*peVar13->_vptr_log_store[2])();
    if (CONCAT44(extraout_var_03,iVar5) <= uVar1) break;
    peVar13 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d28a6);
    (*peVar13->_vptr_log_store[10])(local_360,peVar13,local_340);
    this_01 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d28d1);
    lVar4 = log_entry::get_val_type(this_01);
    if (lVar4 == conf) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 99));
      if (bVar2) {
        peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d2926);
        iVar5 = (*peVar23->_vptr_logger[7])();
        if (3 < iVar5) {
          peVar23 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1d295f);
          msg_if_given_abi_cxx11_
                    ((char *)local_380,
                     "detect a configuration change that is not committed yet at index %lu",
                     local_340);
          (*peVar23->_vptr_logger[8])
                    (peVar23,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"raft_server",0xca,local_380);
          std::__cxx11::string::~string(local_380);
        }
      }
      *(undefined1 *)((long)in_RDI + 0xe9) = 1;
      local_384 = 4;
    }
    else {
      local_384 = 0;
    }
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1d2a3a);
    if (local_384 != 0) break;
    local_340 = local_340 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_510);
  peVar18 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d2a92);
  cluster_config::get_servers_abi_cxx11_(peVar18);
  local_518._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
       ::end((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              *)in_stack_fffffffffffff608);
  peVar18 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d2ac6);
  cluster_config::get_servers_abi_cxx11_(peVar18);
  local_520._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
       ::begin((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                *)in_stack_fffffffffffff608);
  while( true ) {
    bVar2 = std::operator!=(&local_520,&local_518);
    skip_initial_election_timeout = (undefined1)((ulong)poVar14 >> 0x38);
    if (!bVar2) break;
    std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
              ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)
               CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
    std::shared_ptr<nuraft::srv_config>::shared_ptr
              ((shared_ptr<nuraft::srv_config> *)
               CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
               (shared_ptr<nuraft::srv_config> *)in_stack_fffffffffffff608);
    peVar20 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2b3d);
    iVar7 = srv_config::get_id(peVar20);
    if (iVar7 == *(int *)(in_RDI + 7)) {
      peVar20 = std::
                __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2d9e);
      bVar2 = srv_config::is_learner(peVar20);
      *(bool *)(in_RDI + 0x29) = bVar2;
      peVar20 = std::
                __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2dd4);
      iVar7 = srv_config::get_priority(peVar20);
      *(int32 *)((long)in_RDI + 0x3c) = iVar7;
    }
    else {
      local_578 = handle_hb_timeout;
      local_570 = 0;
      std::bind<void(nuraft::raft_server::*)(int),nuraft::raft_server*,std::_Placeholder<1>const&>
                ((offset_in_raft_server_to_subr *)in_stack_fffffffffffff618,
                 (raft_server **)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
                 (_Placeholder<1> *)in_stack_fffffffffffff608);
      std::function<void(int)>::
      function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>))(int)>,void>
                ((function<void_(int)> *)in_stack_fffffffffffff620,
                 (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>
                  *)in_stack_fffffffffffff618);
      peVar20 = std::
                __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2bf1);
      local_59c = srv_config::get_id(peVar20);
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator*
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
                 CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
      cs_new<nuraft::peer,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
                ((shared_ptr<nuraft::srv_config> *)in_stack_fffffffffffff628,
                 in_stack_fffffffffffff620,(function<void_(int)> *)in_stack_fffffffffffff618,
                 (shared_ptr<nuraft::logger> *)
                 CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
      std::make_pair<int,std::shared_ptr<nuraft::peer>>
                ((int *)in_stack_fffffffffffff618,
                 (shared_ptr<nuraft::peer> *)
                 CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610));
      _Var26 = std::
               unordered_map<int,std::shared_ptr<nuraft::peer>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>>
               ::insert<std::pair<int,std::shared_ptr<nuraft::peer>>>
                         ((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                           *)in_stack_fffffffffffff620,
                          (pair<int,_std::shared_ptr<nuraft::peer>_> *)in_stack_fffffffffffff618);
      local_5c0._M_cur =
           (__node_type *)
           _Var26.first.
           super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
           _M_cur;
      local_5b8 = _Var26.second;
      std::pair<int,_std::shared_ptr<nuraft::peer>_>::~pair
                ((pair<int,_std::shared_ptr<nuraft::peer>_> *)0x1d2cd4);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1d2ce1);
      std::function<void_(int)>::~function((function<void_(int)> *)0x1d2cee);
    }
    poVar15 = std::operator<<(&local_500,"peer ");
    peVar20 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2e22);
    iVar7 = srv_config::get_id(peVar20);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar7);
    poVar15 = std::operator<<(poVar15,": DC ID ");
    peVar20 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2e7c);
    iVar7 = srv_config::get_dc_id(peVar20);
    poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar7);
    poVar15 = std::operator<<(poVar15,", ");
    peVar20 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2ed6);
    psVar21 = srv_config::get_endpoint_abi_cxx11_(peVar20);
    poVar15 = std::operator<<(poVar15,(string *)psVar21);
    poVar15 = std::operator<<(poVar15,", ");
    peVar20 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2f23);
    bVar2 = srv_config::is_learner(peVar20);
    pcVar25 = "voting member";
    if (bVar2) {
      pcVar25 = "learner";
    }
    poVar15 = std::operator<<(poVar15,pcVar25);
    poVar15 = std::operator<<(poVar15,", ");
    peVar20 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d2f80);
    iVar7 = srv_config::get_priority(peVar20);
    pvVar10 = (void *)std::ostream::operator<<(poVar15,iVar7);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x1d2fc3);
    std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_520);
  }
  poVar14 = std::operator<<(&local_500,"my id: ");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,*(int *)(in_RDI + 7));
  poVar14 = std::operator<<(poVar14,", ");
  pcVar25 = "voting_member";
  if ((*(byte *)(in_RDI + 0x29) & 1) != 0) {
    pcVar25 = "learner";
  }
  poVar14 = std::operator<<(poVar14,pcVar25);
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<(&local_500,"num peers: ");
  sVar22 = std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::size((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                   *)0x1d30ac);
  pvVar10 = (void *)std::ostream::operator<<(poVar14,sVar22);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 99));
  if (bVar2) {
    peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d3104);
    iVar5 = (*peVar23->_vptr_logger[7])();
    if (3 < iVar5) {
      peVar23 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d3137);
      std::__cxx11::stringstream::str();
      uVar24 = std::__cxx11::string::c_str();
      msg_if_given_abi_cxx11_((char *)local_5e0,"%s",uVar24);
      (*peVar23->_vptr_logger[8])
                (peVar23,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"raft_server",0x101,local_5e0);
      std::__cxx11::string::~string(local_5e0);
      std::__cxx11::string::~string(local_600);
    }
  }
  if ((*(byte *)(in_RDX + 0x28) & 1) != 0) {
    start_server(this_00,(bool)skip_initial_election_timeout);
  }
  std::__cxx11::stringstream::~stringstream(local_510);
  std::__cxx11::stringstream::~stringstream(local_2f8);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x1d3260);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1d326d);
  return;
}

Assistant:

raft_server::raft_server(context* ctx, const init_options& opt)
    : bg_append_ea_(nullptr)
    , initialized_(false)
    , leader_(-1)
    , id_(ctx->state_mgr_->server_id())
    , target_priority_(srv_config::INIT_PRIORITY)
    , votes_responded_(0)
    , votes_granted_(0)
    , leader_commit_index_(0)
    , quick_commit_index_(ctx->state_machine_->last_commit_index())
    , sm_commit_index_(ctx->state_machine_->last_commit_index())
    , initial_commit_index_(ctx->state_machine_->last_commit_index())
    , hb_alive_(false)
    , election_completed_(true)
    , config_changing_(false)
    , catching_up_(false)
    , out_of_log_range_(false)
    , data_fresh_(false)
    , stopping_(false)
    , commit_bg_stopped_(false)
    , append_bg_stopped_(false)
    , write_paused_(false)
    , sm_commit_paused_(false)
    , sm_commit_exec_in_progress_(false)
    , ea_sm_commit_exec_in_progress_(new EventAwaiter())
    , next_leader_candidate_(-1)
    , im_learner_(false)
    , serving_req_(false)
    , steps_to_down_(0)
    , snp_in_progress_(false)
    , ctx_(ctx)
    , scheduler_(ctx->scheduler_)
    , election_exec_(std::bind(&raft_server::handle_election_timeout, this))
    , election_task_(nullptr)
    , role_(srv_role::follower)
    , state_(ctx->state_mgr_->read_state())
    , log_store_(ctx->state_mgr_->load_log_store())
    , state_machine_(ctx->state_machine_)
    , receiving_snapshot_(false)
    , et_cnt_receiving_snapshot_(0)
    , first_snapshot_distance_(0)
    , l_(ctx->logger_)
    , stale_config_(nullptr)
    , config_(ctx->state_mgr_->load_config())
    , uncommitted_config_(nullptr)
    , srv_to_join_(nullptr)
    , srv_to_join_snp_retry_required_(false)
    , srv_to_leave_(nullptr)
    , srv_to_leave_target_idx_(0)
    , conf_to_add_(nullptr)
    , resp_handler_( (rpc_handler)std::bind( &raft_server::handle_peer_resp,
                                             this,
                                             std::placeholders::_1,
                                             std::placeholders::_2 ) )
    , ex_resp_handler_( (rpc_handler)std::bind( &raft_server::handle_ext_resp,
                                                this,
                                                std::placeholders::_1,
                                                std::placeholders::_2 ) )
    , last_snapshot_(ctx->state_machine_->last_snapshot())
    , ea_follower_log_append_(new EventAwaiter())
    , test_mode_flag_(opt.test_mode_flag_)
{
    if (opt.raft_callback_) {
        ctx->set_cb_func(opt.raft_callback_);
    }

    ptr<raft_params> params = ctx_->get_params();
    if (params->stale_log_gap_ < params->fresh_log_gap_) {
        params->stale_log_gap_ = params->fresh_log_gap_;
    }
    if (params->enable_randomized_snapshot_creation_ &&
        !get_last_snapshot() &&
        params->snapshot_distance_ > 1) {
        uint64_t seed = timer_helper::get_timeofday_us() * id_;

        // Flip the integer.
        auto* first = reinterpret_cast<uint8_t*>(&seed);
        auto* last = reinterpret_cast<uint8_t*>(&seed) + sizeof(seed);
        while ((first != last) && (first != -- last)) std::swap(*first++, *last);

        std::default_random_engine engine(seed);
        std::uniform_int_distribution<int32>
            distribution( params->snapshot_distance_ / 2,
                          std::max( params->snapshot_distance_ / 2,
                                    params->snapshot_distance_ - 1 ) );

        first_snapshot_distance_ = distribution(engine);
        p_in("First snapshot creation log distance %u", first_snapshot_distance_);
    }

    apply_and_log_current_params();
    update_rand_timeout();
    precommit_index_ = log_store_->next_slot() - 1;
    lagging_sm_target_index_ = log_store_->next_slot() - 1;

    if (!state_) {
        state_ = cs_new<srv_state>();
        state_->set_term(0);
        state_->set_voted_for(-1);
    }
    vote_init_timer_term_ = state_->get_term();

    ptr<cluster_config> c_conf = get_config();
    std::stringstream init_msg;
    init_msg << "   === INIT RAFT SERVER ===\n"
             << "commit index " << sm_commit_index_ << "\n"
             << "term " << state_->get_term() << "\n"
             << "election timer " << ( state_->is_election_timer_allowed()
                                       ? "allowed" : "not allowed" ) << "\n"
             << "log store start " << log_store_->start_index()
             << ", end " << log_store_->next_slot() - 1 << "\n"
             << "config log idx " << c_conf->get_log_idx()
             << ", prev log idx " << c_conf->get_prev_log_idx() << "\n";
    if (c_conf->is_async_replication()) {
        init_msg << " -- ASYNC REPLICATION --\n";
    }
    p_in("%s", init_msg.str().c_str());

    /**
     * I found this implementation is also a victim of bug
     *     https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E
     * As the implementation is based on Diego's thesis
     *
     * Fix:
     * We should never load configurations that is not committed,
     * this prevents an old server from replicating an obsoleted config to
     * other servers.
     *
     * The prove is as below:
     * Assume S0 is the last committed server set for the old server A
     * |- EXITS Log l which has been committed but l !BELONGS TO A.logs
     *     =>  Vote(A) < Majority(S0)
     * In other words, we need to prove that A cannot be elected to leader
     * if any logs/configs has been committed.
     *
     * Case #1, There is no configuration change since S0, then it's
     *          obvious that
     *          Vote(A) < Majority(S0), see the core Algorithm.
     * Case #2, There are one or more configuration changes since S0,
     *          then at the time of first configuration change was
     *          committed, there are at least Majority(S0 - 1) servers
     *          committed the configuration change
     *          Majority(S0 - 1) + Majority(S0) > S0 => Vote(A) < Majority(S0)
     * -|
     */
    for ( ulong i = std::max( sm_commit_index_ + 1,
                              log_store_->start_index() );
          i < log_store_->next_slot();
          ++i ) {
        auto const entry = log_store_->entry_at(i);
        if (entry->get_val_type() == log_val_type::conf) {
            p_in( "detect a configuration change "
                  "that is not committed yet at index %" PRIu64 "", i );
            config_changing_ = true;
            break;
        }
    }

    std::stringstream peer_info_msg;
    auto srvs_end = c_conf->get_servers().end();
    for (auto it = c_conf->get_servers().begin(); it != srvs_end; ++it) {
        ptr<srv_config> cur_srv = *it;
        if (cur_srv->get_id() != id_) {
            timer_task<int32>::executor exec =
                (timer_task<int32>::executor)
                std::bind( &raft_server::handle_hb_timeout,
                           this,
                           std::placeholders::_1 );
            peers_.insert( std::make_pair
                           ( cur_srv->get_id(),
                             cs_new< peer,
                                     ptr<srv_config>&,
                                     context&,
                                     timer_task<int32>::executor&,
                                     ptr<logger>& >
                                   ( cur_srv, *ctx_, exec, l_ ) ) );
        } else {
            // Myself.
            im_learner_ = cur_srv->is_learner();
            my_priority_ = cur_srv->get_priority();
        }

        // WARNING:
        //   We should set the initial target priority to 1.
        //   When multiple nodes are gone at the same time and
        //   then re-started, and if some nodes cannot decay the
        //   target priority, we can never elect new leader.
        //
        //   (The reason why some nodes cannot decay is because
        //    request vote message resets election timer.)
        //
        // target_priority_ = std::max( target_priority_,
        //                              cur_srv->get_priority() );

        peer_info_msg
            << "peer " << cur_srv->get_id()
            << ": DC ID " << cur_srv->get_dc_id()
            << ", " << cur_srv->get_endpoint()
            << ", " << (cur_srv->is_learner() ? "learner" : "voting member")
            << ", " << cur_srv->get_priority()
            << std::endl;
    }

    peer_info_msg << "my id: " << id_
                  << ", " << ((im_learner_) ? "learner" : "voting_member")
                  << std::endl;
    peer_info_msg << "num peers: " << peers_.size() << std::endl;
    p_in("%s", peer_info_msg.str().c_str());

    if (opt.start_server_in_constructor_) {
        start_server(opt.skip_initial_election_timeout_);
    }
}